

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void parse_constant_table
               (Context *ctx,uint32 *tokens,uint32 bytes,uint32 okay_version,int setvariables,
               CtabData *ctab)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint32 pos;
  MOJOSHADER_uniformType MVar4;
  int iVar5;
  MOJOSHADER_symbol *pMVar6;
  VariableList *pVVar7;
  char *__dest;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  uint uVar13;
  uint32 *start;
  
  if (tokens[1] != 0x42415443) {
    return;
  }
  if (ctab->have_ctab == 0) {
    ctab->have_ctab = 1;
    if (bytes < 0x20) {
      pcVar8 = "Truncated CTAB data";
    }
    else {
      uVar2 = tokens[5];
      if ((uVar2 < 0xf4241 && tokens[2] == 0x1c) &&
         (uVar3 = tokens[6], uVar3 < bytes && (tokens[3] < bytes && tokens[4] == okay_version))) {
        uVar12 = tokens[8];
        if ((uVar12 < bytes && uVar2 * 0x14 <= bytes - uVar3) && (0 < (int)(bytes - uVar12))) {
          start = tokens + 2;
          uVar9 = 0;
          do {
            if (*(char *)((long)start + uVar9 + uVar12) == '\0') {
              ctab->symbols = (MOJOSHADER_symbol *)0x0;
              if (uVar2 == 0) {
                ctab->symbol_count = 0;
                return;
              }
              sVar11 = (ulong)uVar2 * 0x38;
              pMVar6 = (MOJOSHADER_symbol *)(*ctx->malloc)((int)sVar11,ctx->malloc_data);
              if (pMVar6 == (MOJOSHADER_symbol *)0x0) {
                ctx->isfail = 1;
                ctx->out_of_memory = 1;
                ctab->symbols = (MOJOSHADER_symbol *)0x0;
                return;
              }
              ctab->symbols = pMVar6;
              memset(pMVar6,0,sVar11);
              uVar9 = 0;
              ctab->symbol_count = uVar2;
              goto LAB_001146d1;
            }
            uVar9 = uVar9 + 1;
          } while (bytes - uVar12 != uVar9);
        }
      }
LAB_00114655:
      pcVar8 = "Shader has corrupt CTAB data";
    }
  }
  else {
    pcVar8 = "Shader has multiple CTAB sections";
  }
  failf(ctx,"%s",pcVar8);
  return;
LAB_001146d1:
  uVar12 = *(uint *)((long)start + uVar9 * 0x14 + (ulong)uVar3);
  if ((bytes <= uVar12) || ((int)(bytes - uVar12) < 1)) goto LAB_00114655;
  pos = *(uint32 *)((long)start + uVar9 * 0x14 + (ulong)uVar3 + 0xc);
  uVar1 = *(ushort *)((long)start + uVar9 * 0x14 + (ulong)uVar3 + 4);
  pcVar8 = (char *)((ulong)uVar12 + (long)start);
  uVar10 = 0;
  while (pcVar8[uVar10] != '\0') {
    uVar10 = uVar10 + 1;
    if (bytes - uVar12 == uVar10) goto LAB_00114655;
  }
  if ((bytes <= *(uint *)((long)start + uVar9 * 0x14 + (ulong)uVar3 + 0x10)) || (3 < uVar1))
  goto LAB_00114655;
  uVar12 = (uint)*(ushort *)((long)start + uVar9 * 0x14 + (ulong)uVar3 + 6);
  uVar13 = (uint)*(ushort *)((long)start + uVar9 * 0x14 + (ulong)uVar3 + 8);
  switch(uVar1) {
  case 0:
    MVar4 = MOJOSHADER_UNIFORM_BOOL;
    break;
  case 1:
    MVar4 = MOJOSHADER_UNIFORM_INT;
    break;
  case 2:
    MVar4 = MOJOSHADER_UNIFORM_FLOAT;
    break;
  case 3:
    goto switchD_00114762_caseD_3;
  }
  if (setvariables != 0) {
    pVVar7 = (VariableList *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pVVar7 == (VariableList *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      pVVar7->type = MVar4;
      pVVar7->index = uVar12;
      pVVar7->count = uVar13;
      pVVar7->constant = (ConstantsList *)0x0;
      pVVar7->used = 0;
      pVVar7->emit_position = -1;
      pVVar7->next = ctx->variables;
      ctx->variables = pVVar7;
    }
  }
switchD_00114762_caseD_3:
  sVar11 = strlen(pcVar8);
  __dest = (char *)(*ctx->malloc)((int)sVar11 + 1,ctx->malloc_data);
  if (__dest == (char *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    return;
  }
  strcpy(__dest,pcVar8);
  pMVar6 = ctab->symbols + uVar9;
  pMVar6->name = __dest;
  pMVar6->register_set = (uint)uVar1;
  pMVar6->register_index = uVar12;
  pMVar6->register_count = uVar13;
  iVar5 = parse_ctab_typeinfo(ctx,(uint8 *)start,bytes,pos,&pMVar6->info,0);
  if (iVar5 == 0) goto LAB_00114655;
  if (ctx->out_of_memory != 0) {
    return;
  }
  uVar9 = uVar9 + 1;
  if (uVar9 == uVar2) {
    return;
  }
  goto LAB_001146d1;
}

Assistant:

static void parse_constant_table(Context *ctx, const uint32 *tokens,
                                 const uint32 bytes, const uint32 okay_version,
                                 const int setvariables, CtabData *ctab)
{
    const uint32 id = SWAP32(tokens[1]);
    if (id != CTAB_ID)
        return;  // not the constant table.

    if (ctab->have_ctab)  // !!! FIXME: can you have more than one?
    {
        fail(ctx, "Shader has multiple CTAB sections");
        return;
    } // if

    ctab->have_ctab = 1;

    const uint8 *start = (uint8 *) &tokens[2];

    if (bytes < 32)
    {
        fail(ctx, "Truncated CTAB data");
        return;
    } // if

    const uint32 size = SWAP32(tokens[2]);
    const uint32 creator = SWAP32(tokens[3]);
    const uint32 version = SWAP32(tokens[4]);
    const uint32 constants = SWAP32(tokens[5]);
    const uint32 constantinfo = SWAP32(tokens[6]);
    const uint32 target = SWAP32(tokens[8]);

    if (size != CTAB_SIZE)
        goto corrupt_ctab;
    else if (constants > 1000000)  // sanity check.
        goto corrupt_ctab;

    if (version != okay_version) goto corrupt_ctab;
    if (creator >= bytes) goto corrupt_ctab;
    if (constantinfo >= bytes) goto corrupt_ctab;
    if ((bytes - constantinfo) < (constants * CINFO_SIZE)) goto corrupt_ctab;
    if (target >= bytes) goto corrupt_ctab;
    if (!parse_ctab_string(start, bytes, target)) goto corrupt_ctab;
    // !!! FIXME: check that (start+target) points to "ps_3_0", etc.

    ctab->symbols = NULL;
    if (constants > 0)
    {
        ctab->symbols = (MOJOSHADER_symbol *) Malloc(ctx, sizeof (MOJOSHADER_symbol) * constants);
        if (ctab->symbols == NULL)
            return;
        memset(ctab->symbols, '\0', sizeof (MOJOSHADER_symbol) * constants);
    } // if
    ctab->symbol_count = constants;

    uint32 i = 0;
    for (i = 0; i < constants; i++)
    {
        const uint8 *ptr = start + constantinfo + (i * CINFO_SIZE);
        const uint32 name = SWAP32(*((uint32 *) (ptr + 0)));
        const uint16 regset = SWAP16(*((uint16 *) (ptr + 4)));
        const uint16 regidx = SWAP16(*((uint16 *) (ptr + 6)));
        const uint16 regcnt = SWAP16(*((uint16 *) (ptr + 8)));
        const uint32 typeinf = SWAP32(*((uint32 *) (ptr + 12)));
        const uint32 defval = SWAP32(*((uint32 *) (ptr + 16)));
        MOJOSHADER_uniformType mojotype = MOJOSHADER_UNIFORM_UNKNOWN;

        if (!parse_ctab_string(start, bytes, name)) goto corrupt_ctab;
        if (defval >= bytes) goto corrupt_ctab;

        switch (regset)
        {
            case 0: mojotype = MOJOSHADER_UNIFORM_BOOL; break;
            case 1: mojotype = MOJOSHADER_UNIFORM_INT; break;
            case 2: mojotype = MOJOSHADER_UNIFORM_FLOAT; break;
            case 3: /* SAMPLER */ break;
            default: goto corrupt_ctab;
        } // switch

        if ((setvariables) && (mojotype != MOJOSHADER_UNIFORM_UNKNOWN))
        {
            VariableList *item;
            item = (VariableList *) Malloc(ctx, sizeof (VariableList));
            if (item != NULL)
            {
                item->type = mojotype;
                item->index = regidx;
                item->count = regcnt;
                item->constant = NULL;
                item->used = 0;
                item->emit_position = -1;
                item->next = ctx->variables;
                ctx->variables = item;
            } // if
        } // if

        // Add the symbol.
        const char *namecpy = StrDup(ctx, (const char *) (start + name));
        if (namecpy == NULL)
            return;

        MOJOSHADER_symbol *sym = &ctab->symbols[i];
        sym->name = namecpy;
        sym->register_set = (MOJOSHADER_symbolRegisterSet) regset;
        sym->register_index = (unsigned int) regidx;
        sym->register_count = (unsigned int) regcnt;
        if (!parse_ctab_typeinfo(ctx, start, bytes, typeinf, &sym->info, 0))
            goto corrupt_ctab;  // sym->name will get free()'d later.
        else if (ctx->out_of_memory)
            return;  // just bail now.
    } // for

    return;

corrupt_ctab:
    fail(ctx, "Shader has corrupt CTAB data");
}